

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::PointInstancer>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               PointInstancer *instancer,string *warn,string *err,PrimReconstructOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *pcVar2;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pcVar4;
  optional<unsigned_int> oVar5;
  pointer pPVar6;
  optional<unsigned_int> oVar7;
  optional<unsigned_int> oVar8;
  pointer pSVar9;
  size_type sVar10;
  ostringstream oVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  undefined7 extraout_var;
  ostream *poVar15;
  long *plVar16;
  undefined8 *puVar17;
  const_iterator cVar18;
  mapped_type *this_00;
  Property *pPVar19;
  anon_struct_8_0_00000001_for___align __n;
  char cVar20;
  ulong uVar21;
  key_type *pkVar22;
  string *__v;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  Property *pPVar25;
  _Rb_tree_header *p_Var26;
  Property *pPVar27;
  long lVar28;
  bool bVar29;
  Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_> dst;
  ParseResult ret;
  optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_> pv;
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined4 in_stack_fffffffffffffafc;
  undefined1 local_500 [8];
  char *local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  undefined1 local_4d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  undefined1 uStack_4a8;
  undefined7 uStack_4a7;
  undefined1 uStack_4a0;
  undefined1 local_490 [8];
  _Alloc_hider local_488;
  undefined1 auStack_480 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_478;
  size_type sStack_458;
  undefined8 uStack_450;
  Property *local_448;
  Property *local_440;
  undefined4 local_434;
  key_type *local_430;
  AttrMetas *local_428;
  PointInstancer *local_420;
  undefined8 local_418;
  char local_410;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> local_408;
  string local_3f0;
  string local_3d0;
  TimeSamples *local_3b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_> local_378;
  undefined1 local_358 [8];
  undefined1 local_350 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined2 local_338;
  _Alloc_hider local_330;
  pointer local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_320 [3];
  ios_base local_2e8 [16];
  ios_base local_2d8 [264];
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined8 local_1b0;
  string *local_1a8;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_1a0;
  optional<tinyusdz::Relationship> *local_170;
  undefined1 local_168 [40];
  undefined1 local_140 [32];
  long local_120 [2];
  string local_110 [16];
  undefined8 local_100 [2];
  _Base_ptr *local_f0 [2];
  _Base_ptr local_e0 [2];
  pointer *local_d0 [2];
  pointer local_c0 [2];
  _Alloc_hider *local_b0 [2];
  _Alloc_hider local_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40 [2];
  
  local_3a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3a8._M_impl.super__Rb_tree_header._M_header;
  local_3a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_418 = 0;
  local_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar13 = (uint)options->strict_allowedToken_check;
  local_420 = instancer;
  local_3a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar12 = anon_unknown_0::ReconstructGPrimProperties
                     (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_3a8,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *)properties,&instancer->super_GPrim,warn,err,
                      options->strict_allowedToken_check);
  if (bVar12) {
    pPVar19 = (Property *)(properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var26 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    local_418 = CONCAT71(extraout_var,pPVar19 == (Property *)p_Var26);
    if (pPVar19 != (Property *)p_Var26) {
      local_168._16_8_ = &local_420->protoIndices;
      local_168._8_8_ = &local_420->ids;
      local_168._0_8_ = &local_420->positions;
      local_428 = &(local_420->orientations)._metas;
      local_1a0._32_8_ = &(local_420->orientations)._paths;
      local_1a0.data._0_8_ = (undefined8)&(local_420->orientations)._attrib;
      local_1a0._40_8_ = &local_420->scales;
      local_1a0._24_8_ = &local_420->velocities;
      local_1a0._16_8_ = &local_420->accelerations;
      local_1a0._8_8_ = &local_420->angularVelocities;
      local_1a8 = (string *)&local_420->invisibleIds;
      local_1b0 = &(local_420->super_GPrim).props;
      local_170 = &local_420->prototypes;
      local_440 = (Property *)p_Var26;
      do {
        local_430 = (key_type *)&(pPVar19->_attrib)._variability;
        iVar14 = ::std::__cxx11::string::compare((char *)local_430);
        if (iVar14 == 0) {
          local_448 = pPVar19;
          local_358 = (undefined1  [8])(local_350 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"prototypes","");
          cVar18 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_3a8,(key_type *)local_358);
          if (local_358 != (undefined1  [8])(local_350 + 8)) {
            operator_delete((void *)local_358,(ulong)(local_348._M_allocated_capacity + 1));
          }
          pPVar19 = local_448;
          iVar14 = 3;
          pPVar27 = local_440;
          if ((_Rb_tree_header *)cVar18._M_node == &local_3a8._M_impl.super__Rb_tree_header) {
            if (((undefined1  [16])(local_448->_rel).targetPath._prop_part.field_2 &
                (undefined1  [16])0xfffffffe00000000) != (undefined1  [16])0x200000000) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_358,0xf54);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_4d8._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_4d8 + 0x10);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4d8,"`{}` must be a Relationship","");
              fmt::format<char[11]>
                        ((string *)local_490,(string *)local_4d8,(char (*) [11])"prototypes");
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_358,(char *)local_490,(long)local_488._M_p);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              pPVar27 = local_440;
              if (local_490 != (undefined1  [8])auStack_480) {
                operator_delete((void *)local_490,(ulong)((long)auStack_480 + 1));
              }
              pPVar19 = local_448;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4d8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_4d8 + 0x10)) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar17 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    (local_4d8,(ulong)(err->_M_dataplus)._M_p);
                pcVar2 = (char *)(puVar17 + 2);
                if ((char *)*puVar17 == pcVar2) {
                  auStack_480 = *(undefined1 (*) [8])pcVar2;
                  bStack_478._M_dataplus._M_p = (pointer)puVar17[3];
                  local_490 = (undefined1  [8])auStack_480;
                }
                else {
                  auStack_480 = *(undefined1 (*) [8])pcVar2;
                  local_490 = (undefined1  [8])*puVar17;
                }
                local_488._M_p = (pointer)puVar17[1];
                *puVar17 = pcVar2;
                puVar17[1] = 0;
                *(undefined1 *)(puVar17 + 2) = 0;
                goto LAB_0022ffdb;
              }
              goto LAB_00230011;
            }
            nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                      (local_170,
                       (Relationship *)((long)&(local_448->_rel).targetPath._prop_part.field_2 + 8))
            ;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_3a8,local_430);
            pPVar27 = local_440;
          }
        }
        else {
          local_70._M_allocated_capacity = (size_type)local_60;
          lVar28 = *(long *)&(pPVar19->_attrib)._variability;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,lVar28,
                     (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar28);
          pPVar27 = (Property *)((long)&(pPVar19->_attrib)._type_name.field_2 + 8);
          pPVar25 = (Property *)local_358;
          local_358 = (undefined1  [8])(local_350 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar25,"protoIndices","");
          local_448 = pPVar27;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    ((ParseResult *)local_490,(_anonymous_namespace_ *)&local_3a8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_70,(string *)pPVar27,pPVar25,(string *)local_168._16_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffafc,uVar13));
          if (local_358 != (undefined1  [8])(local_350 + 8)) {
            operator_delete((void *)local_358,(ulong)(local_348._M_allocated_capacity + 1));
          }
          if ((_Alloc_hider *)local_70._M_allocated_capacity != local_60) {
            operator_delete((void *)local_70._M_allocated_capacity,(ulong)(local_60[0]._M_p + 1));
          }
          pPVar27 = local_440;
          iVar14 = 0;
          if (((ulong)local_490 & 0xfffffffd) == 0) {
            iVar14 = 3;
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (local_490._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_358,0xf55);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_500 = (undefined1  [8])&local_4f0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_500,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[13],std::__cxx11::string>
                        ((string *)local_4d8,(fmt *)local_500,(string *)"protoIndices",
                         (char (*) [13])&local_488,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar25);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_358,(char *)local_4d8._0_8_,
                                   CONCAT62(local_4d8._10_6_,local_4d8._8_2_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4d8 + 0x10);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4d8._0_8_ != pbVar3) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
              }
              if (local_500 != (undefined1  [8])&local_4f0) {
                operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar16 = (long *)::std::__cxx11::string::_M_append
                                            (local_500,(ulong)(err->_M_dataplus)._M_p);
                pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (plVar16 + 2);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16 ==
                    pbVar1) {
                  pcVar4 = (pbVar1->_M_dataplus)._M_p;
                  local_4d8._16_2_ = SUB82(pcVar4,0);
                  local_4d8._18_6_ = (undefined6)((ulong)pcVar4 >> 0x10);
                  local_4d8._24_2_ = (undefined2)plVar16[3];
                  local_4d8._26_6_ = (undefined6)((ulong)plVar16[3] >> 0x10);
                  local_4d8._0_8_ = pbVar3;
                }
                else {
                  pcVar4 = (pbVar1->_M_dataplus)._M_p;
                  local_4d8._16_2_ = SUB82(pcVar4,0);
                  local_4d8._18_6_ = (undefined6)((ulong)pcVar4 >> 0x10);
                  local_4d8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16
                  ;
                }
                local_4d8._8_2_ = (undefined2)plVar16[1];
                local_4d8._10_6_ = (undefined6)((ulong)plVar16[1] >> 0x10);
                *plVar16 = (long)pbVar1;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_4d8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4d8._0_8_ != pbVar3) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
                }
                if (local_500 != (undefined1  [8])&local_4f0) {
                  operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
              ::std::ios_base::~ios_base(local_2e8);
              iVar14 = 1;
              bVar12 = false;
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._M_p !=
              &bStack_478) {
            operator_delete(local_488._M_p,(long)bStack_478._M_dataplus._M_p + 1);
          }
          if (!bVar12) goto LAB_00231d54;
          local_90._M_allocated_capacity = (size_type)local_80;
          lVar28 = *(long *)&(pPVar19->_attrib)._variability;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,lVar28,
                     (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar28);
          pPVar25 = (Property *)local_358;
          local_358 = (undefined1  [8])(local_350 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar25,"ids","");
          (anonymous_namespace)::ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                    ((ParseResult *)local_490,(_anonymous_namespace_ *)&local_3a8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_90,(string *)local_448,pPVar25,(string *)local_168._8_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffafc,uVar13));
          if (local_358 != (undefined1  [8])(local_350 + 8)) {
            operator_delete((void *)local_358,(ulong)(local_348._M_allocated_capacity + 1));
          }
          if ((_Alloc_hider *)local_90._M_allocated_capacity != local_80) {
            operator_delete((void *)local_90._M_allocated_capacity,(ulong)(local_80[0]._M_p + 1));
          }
          iVar14 = 0;
          if (((ulong)local_490 & 0xfffffffd) == 0) {
            iVar14 = 3;
LAB_0022fd12:
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (local_490._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_358,0xf56);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_500 = (undefined1  [8])&local_4f0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_500,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[4],std::__cxx11::string>
                        ((string *)local_4d8,(fmt *)local_500,(string *)"ids",
                         (char (*) [4])&local_488,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar25);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_358,(char *)local_4d8._0_8_,
                                   CONCAT62(local_4d8._10_6_,local_4d8._8_2_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4d8 + 0x10);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4d8._0_8_ != pbVar3) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
              }
              if (local_500 != (undefined1  [8])&local_4f0) {
                operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar16 = (long *)::std::__cxx11::string::_M_append
                                            (local_500,(ulong)(err->_M_dataplus)._M_p);
                pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (plVar16 + 2);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16 ==
                    pbVar1) {
                  pcVar4 = (pbVar1->_M_dataplus)._M_p;
                  local_4d8._16_2_ = SUB82(pcVar4,0);
                  local_4d8._18_6_ = (undefined6)((ulong)pcVar4 >> 0x10);
                  local_4d8._24_2_ = (undefined2)plVar16[3];
                  local_4d8._26_6_ = (undefined6)((ulong)plVar16[3] >> 0x10);
                  local_4d8._0_8_ = pbVar3;
                }
                else {
                  pcVar4 = (pbVar1->_M_dataplus)._M_p;
                  local_4d8._16_2_ = SUB82(pcVar4,0);
                  local_4d8._18_6_ = (undefined6)((ulong)pcVar4 >> 0x10);
                  local_4d8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16
                  ;
                }
                local_4d8._8_2_ = (undefined2)plVar16[1];
                local_4d8._10_6_ = (undefined6)((ulong)plVar16[1] >> 0x10);
                *plVar16 = (long)pbVar1;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_4d8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4d8._0_8_ != pbVar3) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
                }
                if (local_500 != (undefined1  [8])&local_4f0) {
                  operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
              ::std::ios_base::~ios_base(local_2e8);
              iVar14 = 1;
              goto LAB_0022fd12;
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._M_p !=
              &bStack_478) {
            operator_delete(local_488._M_p,(long)bStack_478._M_dataplus._M_p + 1);
          }
          if (!bVar12) goto LAB_00231d54;
          local_b0[0] = local_a0;
          lVar28 = *(long *)&(pPVar19->_attrib)._variability;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b0,lVar28,
                     (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar28);
          pPVar25 = (Property *)local_358;
          local_358 = (undefined1  [8])(local_350 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar25,"positions","");
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                    ((ParseResult *)local_490,(_anonymous_namespace_ *)&local_3a8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_b0,(string *)local_448,pPVar25,(string *)local_168._0_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffafc,uVar13));
          if (local_358 != (undefined1  [8])(local_350 + 8)) {
            operator_delete((void *)local_358,(ulong)(local_348._M_allocated_capacity + 1));
          }
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],(ulong)(local_a0[0]._M_p + 1));
          }
          iVar14 = 0;
          if (((ulong)local_490 & 0xfffffffd) == 0) {
            iVar14 = 3;
LAB_002300be:
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (local_490._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_358,0xf57);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_500 = (undefined1  [8])&local_4f0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_500,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[10],std::__cxx11::string>
                        ((string *)local_4d8,(fmt *)local_500,(string *)"positions",
                         (char (*) [10])&local_488,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar25);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_358,(char *)local_4d8._0_8_,
                                   CONCAT62(local_4d8._10_6_,local_4d8._8_2_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4d8 + 0x10);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4d8._0_8_ != pbVar3) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
              }
              if (local_500 != (undefined1  [8])&local_4f0) {
                operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar16 = (long *)::std::__cxx11::string::_M_append
                                            (local_500,(ulong)(err->_M_dataplus)._M_p);
                pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (plVar16 + 2);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16 ==
                    pbVar1) {
                  pcVar4 = (pbVar1->_M_dataplus)._M_p;
                  local_4d8._16_2_ = SUB82(pcVar4,0);
                  local_4d8._18_6_ = (undefined6)((ulong)pcVar4 >> 0x10);
                  local_4d8._24_2_ = (undefined2)plVar16[3];
                  local_4d8._26_6_ = (undefined6)((ulong)plVar16[3] >> 0x10);
                  local_4d8._0_8_ = pbVar3;
                }
                else {
                  pcVar4 = (pbVar1->_M_dataplus)._M_p;
                  local_4d8._16_2_ = SUB82(pcVar4,0);
                  local_4d8._18_6_ = (undefined6)((ulong)pcVar4 >> 0x10);
                  local_4d8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16
                  ;
                }
                local_4d8._8_2_ = (undefined2)plVar16[1];
                local_4d8._10_6_ = (undefined6)((ulong)plVar16[1] >> 0x10);
                *plVar16 = (long)pbVar1;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_4d8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4d8._0_8_ != pbVar3) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
                }
                if (local_500 != (undefined1  [8])&local_4f0) {
                  operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
              ::std::ios_base::~ios_base(local_2e8);
              iVar14 = 1;
              goto LAB_002300be;
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._M_p !=
              &bStack_478) {
            operator_delete(local_488._M_p,(long)bStack_478._M_dataplus._M_p + 1);
          }
          if (!bVar12) goto LAB_00231d54;
          local_1d0._0_8_ = &local_1c0;
          lVar28 = *(long *)&(pPVar19->_attrib)._variability;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1d0,lVar28,
                     (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar28);
          local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"orientations","");
          uVar23 = local_1d0._8_8_;
          sVar10 = local_3f0._M_string_length;
          local_4f8 = local_4f0._M_local_buf + 8;
          local_4f0._M_allocated_capacity = 0;
          local_4f0._M_local_buf[8] = '\0';
          __n = (anon_struct_8_0_00000001_for___align)local_1d0._8_8_;
          if (local_3f0._M_string_length < (ulong)local_1d0._8_8_) {
            __n = (anon_struct_8_0_00000001_for___align)local_3f0._M_string_length;
          }
          if (__n == (anon_struct_8_0_00000001_for___align)0x0) {
            bVar12 = true;
          }
          else {
            iVar14 = bcmp((void *)local_1d0._0_8_,local_3f0._M_dataplus._M_p,(size_t)__n);
            bVar12 = iVar14 == 0;
          }
          pPVar27 = local_440;
          if ((bool)(bVar12 ^ 1U | uVar23 != sVar10)) {
            local_500._0_4_ = 1;
          }
          else {
            if (((undefined1  [16])(pPVar19->_rel).targetPath._prop_part.field_2 &
                (undefined1  [16])0xfffffffe00000000) == (undefined1  [16])0x200000000) {
              local_500._0_4_ = 7;
              local_4d8._0_8_ = &DAT_0000003e;
              local_490 = (undefined1  [8])auStack_480;
              local_490 = (undefined1  [8])
                          ::std::__cxx11::string::_M_create((ulong *)local_490,(ulong)local_4d8);
              auStack_480 = (undefined1  [8])local_4d8._0_8_;
              builtin_strncpy((char *)local_490,
                              "Property `{}` must be Attribute, but declared as Relationship.",0x3e)
              ;
              local_488._M_p = (pointer)local_4d8._0_8_;
              *(char *)((long)local_490 + local_4d8._0_8_) = '\0';
              fmt::format<std::__cxx11::string>
                        ((string *)local_358,(fmt *)local_490,&local_3f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4d8._0_8_);
              ::std::__cxx11::string::operator=((string *)&local_4f8,(string *)local_358);
              if (local_358 != (undefined1  [8])(local_350 + 8)) {
                operator_delete((void *)local_358,(ulong)(local_348._M_allocated_capacity + 1));
              }
              if (local_490 != (undefined1  [8])auStack_480) {
                operator_delete((void *)local_490,(ulong)((long)auStack_480 + 1));
              }
            }
            if (*(long *)((long)&(pPVar19->_attrib)._metas.comment.contained + 0x10) !=
                *(long *)((long)&(pPVar19->_attrib)._metas.comment.contained + 8)) {
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_1a0._32_8_
                         ,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                          ((long)&(pPVar19->_attrib)._metas.comment.contained + 8));
              local_500 = (undefined1  [8])((ulong)local_500 & 0xffffffff00000000);
            }
            Attribute::type_name_abi_cxx11_(&local_3d0,&local_448->_attrib);
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>::
            type_name_abi_cxx11_();
            if (local_350 == (undefined1  [8])local_3d0._M_string_length) {
              if (local_350 == (undefined1  [8])0x0) {
                bVar12 = true;
              }
              else {
                iVar14 = bcmp((void *)local_358,local_3d0._M_dataplus._M_p,(size_t)local_350);
                bVar12 = iVar14 == 0;
              }
            }
            else {
              bVar12 = false;
            }
            bVar29 = true;
            if (!bVar12) {
              tinyusdz::value::
              TypeTraits<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
              ::underlying_type_name_abi_cxx11_();
              if (local_50._8_8_ == local_3d0._M_string_length) {
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_50._8_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  iVar14 = bcmp((void *)local_50._M_allocated_capacity,local_3d0._M_dataplus._M_p,
                                local_50._8_8_);
                  bVar29 = iVar14 == 0;
                }
              }
              else {
                bVar29 = false;
              }
            }
            if ((!bVar12) && ((_Alloc_hider *)local_50._M_allocated_capacity != local_40)) {
              operator_delete((void *)local_50._M_allocated_capacity,(ulong)(local_40[0]._M_p + 1));
            }
            if (local_358 != (undefined1  [8])(local_350 + 8)) {
              operator_delete((void *)local_358,(ulong)(local_348._M_allocated_capacity + 1));
            }
            if (bVar29) {
              iVar14 = *(int *)((long)&(pPVar19->_rel).targetPath._prop_part.field_2 + 4);
              if (iVar14 != 1) {
                if (iVar14 == 0) {
                  (local_420->orientations)._value_empty = true;
                  AttrMetas::operator=
                            (local_428,
                             (AttrMetas *)
                             ((long)&(pPVar19->_attrib)._metas.comment.contained + 0x20));
                  __v = &local_3f0;
LAB_00230b06:
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_3a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __v);
                  local_500 = (undefined1  [8])((ulong)local_500 & 0xffffffff00000000);
                }
                else {
                  pPVar25 = (Property *)0x25;
                  ::std::__cxx11::string::_M_replace
                            ((ulong)&local_4f8,0,(char *)local_4f0._M_allocated_capacity,0x601f00);
                  local_500._0_4_ = 8;
                }
                goto LAB_00230b13;
              }
              oVar5.has_value_ = (pPVar19->_attrib)._metas.hidden.has_value_;
              oVar5._1_1_ = (pPVar19->_attrib)._metas.hidden.contained;
              oVar5._2_2_ = *(undefined2 *)&(pPVar19->_attrib)._metas.field_0x12;
              oVar5.contained = *(storage_t<unsigned_int> *)&(pPVar19->_attrib)._metas.field_0x14;
              if (oVar5 == (pPVar19->_attrib)._metas.elementSize) {
                pPVar6 = (pPVar19->_attrib)._paths.
                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage;
                if (pPVar6 == (pointer)0x0) {
                  bVar12 = false;
                }
                else {
                  iVar14 = (*(code *)(pPVar6->_prim_part)._M_dataplus._M_p)();
                  bVar12 = iVar14 == 4;
                }
                if ((bVar12) || (((pPVar19->_attrib)._metas.interpolation.has_value_ & 1U) != 0)) {
                  (local_420->orientations)._blocked = true;
                }
              }
              if (((pPVar19->_attrib)._metas.interpolation.has_value_ == false) &&
                 ((((pPVar6 = (pPVar19->_attrib)._paths.
                              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                    pPVar6 != (pointer)0x0 &&
                    (iVar14 = (*(code *)(pPVar6->_prim_part)._M_dataplus._M_p)(), iVar14 == 0)) ||
                   ((pPVar6 = (pPVar19->_attrib)._paths.
                              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                    pPVar6 != (pointer)0x0 &&
                    (iVar14 = (*(code *)(pPVar6->_prim_part)._M_dataplus._M_p)(), iVar14 == 1)))) &&
                  (oVar7.has_value_ = (pPVar19->_attrib)._metas.hidden.has_value_,
                  oVar7._1_1_ = (pPVar19->_attrib)._metas.hidden.contained,
                  oVar7._2_2_ = *(undefined2 *)&(pPVar19->_attrib)._metas.field_0x12,
                  oVar7.contained =
                       *(storage_t<unsigned_int> *)&(pPVar19->_attrib)._metas.field_0x14,
                  oVar7 == (pPVar19->_attrib)._metas.elementSize)))) {
                bVar12 = true;
                bVar29 = false;
              }
              else {
                this = &(pPVar19->_attrib)._paths;
                uStack_4a8 = 0;
                uStack_4a7 = 0;
                uStack_4a0 = 0;
                local_4b8._M_allocated_capacity = 0;
                local_4b8._M_local_buf[8] = '\0';
                local_4b8._9_7_ = 0;
                local_4d8._16_2_ = 0;
                local_4d8._18_6_ = 0;
                local_4d8._24_2_ = 0;
                local_4d8._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_4d8._8_2_ = 0;
                local_4d8._10_6_ = 0;
                bVar12 = primvar::PrimVar::is_valid((PrimVar *)this);
                if (bVar12) {
                  if (((pPVar19->_attrib)._metas.interpolation.has_value_ == false) &&
                     (((pPVar6 = (pPVar19->_attrib)._paths.
                                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       pPVar6 != (pointer)0x0 &&
                       (iVar14 = (*(code *)(pPVar6->_prim_part)._M_dataplus._M_p)(), iVar14 == 0))
                      || ((pPVar6 = (pPVar19->_attrib)._paths.
                                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          pPVar6 != (pointer)0x0 &&
                          (iVar14 = (*(code *)(pPVar6->_prim_part)._M_dataplus._M_p)(), iVar14 == 1)
                          ))))) {
                    cVar20 = '\0';
                  }
                  else {
                    primvar::PrimVar::
                    get_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                              (&local_378,(PrimVar *)this);
                    cVar20 = local_378.has_value_;
                    local_410 = local_378.has_value_;
                    if (local_378.has_value_ == true) {
                      local_408.
                      super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)local_378.contained.data._0_8_;
                      local_408.
                      super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)local_378.contained._8_8_;
                      local_408.
                      super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)local_378.contained._16_8_;
                      local_378.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                      local_378.contained._8_8_ = 0;
                      local_378.contained._16_8_ = 0;
                      ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                      ::operator=((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                   *)local_4d8,&local_408);
                      local_4d8._24_2_ = 1;
                    }
                    if ((local_410 == '\x01') &&
                       ((anon_struct_8_0_00000001_for___align)
                        local_408.
                        super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (anon_struct_8_0_00000001_for___align)0x0)) {
                      operator_delete(local_408.
                                      super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_408.
                                            super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_408.
                                            super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  oVar8.has_value_ = (pPVar19->_attrib)._metas.hidden.has_value_;
                  oVar8._1_1_ = (pPVar19->_attrib)._metas.hidden.contained;
                  oVar8._2_2_ = *(undefined2 *)&(pPVar19->_attrib)._metas.field_0x12;
                  oVar8.contained =
                       *(storage_t<unsigned_int> *)&(pPVar19->_attrib)._metas.field_0x14;
                  if (oVar8 == (pPVar19->_attrib)._metas.elementSize) {
                    if (cVar20 == '\0') goto LAB_002306b0;
                  }
                  else {
                    local_3b0 = (TimeSamples *)&(pPVar19->_attrib)._metas.elementSize;
                    local_434 = (undefined4)CONCAT71((int7)((ulong)local_3b0 >> 8),local_490[0]);
                    lVar28 = 0;
                    uVar21 = 0;
                    do {
                      if (*(char *)&(pPVar19->_attrib)._metas.comment.contained == '\x01') {
                        tinyusdz::value::TimeSamples::update(local_3b0);
                      }
                      pSVar9 = (local_3b0->_samples).
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      if ((&pSVar9->blocked)[lVar28] == true) {
                        TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                        ::add_blocked_sample
                                  ((TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                    *)&local_4b8,*(double *)((long)&pSVar9->t + lVar28));
                      }
                      else {
                        tinyusdz::value::Value::
                        get_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                                  (&local_378,(Value *)((long)&(pSVar9->value).v_ + lVar28),false);
                        bVar12 = local_378.has_value_;
                        local_410 = local_378.has_value_;
                        if (local_378.has_value_ == true) {
                          local_408.
                          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                               (pointer)local_378.contained.data._0_8_;
                          local_408.
                          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               (pointer)local_378.contained._8_8_;
                          local_408.
                          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (pointer)local_378.contained._16_8_;
                          local_378.contained.data.__align =
                               (anon_struct_8_0_00000001_for___align)0x0;
                          local_378.contained._8_8_ = 0;
                          local_378.contained._16_8_ = 0;
                          TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                          ::add_sample((TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                        *)&local_4b8,*(double *)((long)&pSVar9->t + lVar28),
                                       &local_408);
                        }
                        else {
                          sStack_458 = 0;
                          uStack_450 = 0;
                          bStack_478.field_2._M_allocated_capacity = 0;
                          bStack_478.field_2._8_8_ = 0;
                          bStack_478._M_dataplus._M_p = (pointer)0x0;
                          bStack_478._M_string_length = 0;
                          local_488._M_p = (pointer)0x0;
                          auStack_480 = (undefined1  [8])0x0;
                          local_434 = 0;
                        }
                        if ((local_410 == '\x01') &&
                           ((anon_struct_8_0_00000001_for___align)
                            local_408.
                            super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (anon_struct_8_0_00000001_for___align)0x0)) {
                          operator_delete(local_408.
                                          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_408.
                                                super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_408.
                                                super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        pPVar27 = local_440;
                        if (bVar12 == false) {
                          local_490[0] = (fmt)(char)local_434;
                          goto LAB_00230971;
                        }
                      }
                      uVar21 = uVar21 + 1;
                      lVar28 = lVar28 + 0x28;
                    } while (uVar21 < (ulong)((*(long *)&(pPVar19->_attrib)._metas.hidden -
                                               (long)(pPVar19->_attrib)._metas.elementSize >> 3) *
                                             -0x3333333333333333));
                    local_490 = (undefined1  [8])((ulong)local_490 & 0xffffffffffffff00);
                  }
                  local_490[0] = (fmt)0x1;
                  local_488._M_p = (pointer)local_4d8._0_8_;
                  auStack_480 = (undefined1  [8])CONCAT62(local_4d8._10_6_,local_4d8._8_2_);
                  bStack_478._M_dataplus._M_p = (pointer)CONCAT62(local_4d8._18_6_,local_4d8._16_2_)
                  ;
                  local_4d8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_4d8._8_2_ = 0;
                  local_4d8._10_6_ = 0;
                  local_4d8._16_2_ = 0;
                  local_4d8._18_6_ = 0;
                  bStack_478._M_string_length =
                       CONCAT62(bStack_478._M_string_length._2_6_,local_4d8._24_2_);
                  bStack_478.field_2._M_allocated_capacity = local_4b8._M_allocated_capacity;
                  bStack_478.field_2._8_8_ = CONCAT71(local_4b8._9_7_,local_4b8._M_local_buf[8]);
                  sStack_458 = CONCAT71(uStack_4a7,uStack_4a8);
                  uStack_4a8 = 0;
                  uStack_4a7 = 0;
                  local_4b8._M_allocated_capacity = 0;
                  local_4b8._M_local_buf[8] = '\0';
                  local_4b8._9_7_ = 0;
                  uStack_450 = CONCAT71(uStack_450._1_7_,uStack_4a0);
                }
                else {
LAB_002306b0:
                  local_490 = (undefined1  [8])((ulong)local_490 & 0xffffffffffffff00);
                  sStack_458 = 0;
                  uStack_450 = 0;
                  bStack_478.field_2._M_allocated_capacity = 0;
                  bStack_478.field_2._8_8_ = 0;
                  bStack_478._M_dataplus._M_p = (pointer)0x0;
                  bStack_478._M_string_length = 0;
                  local_488._M_p = (pointer)0x0;
                  auStack_480 = (undefined1  [8])0x0;
                }
LAB_00230971:
                ::std::
                vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample>_>
                ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample>_>
                           *)&local_4b8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4d8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT62(local_4d8._18_6_,local_4d8._16_2_) - local_4d8._0_8_);
                }
                local_358[0] = (ostringstream)local_490[0];
                if (local_490[0] == (fmt)0x1) {
                  local_350 = (undefined1  [8])local_488._M_p;
                  local_348._M_allocated_capacity = (size_type)auStack_480;
                  local_348._8_8_ = bStack_478._M_dataplus._M_p;
                  bStack_478._M_dataplus._M_p = (pointer)0x0;
                  local_488._M_p = (pointer)0x0;
                  auStack_480 = (undefined1  [8])0x0;
                  local_338 = (undefined2)bStack_478._M_string_length;
                  local_330._M_p = (pointer)bStack_478.field_2._M_allocated_capacity;
                  local_328 = (pointer)bStack_478.field_2._8_8_;
                  aaStack_320[0]._M_allocated_capacity = sStack_458;
                  sStack_458 = 0;
                  bStack_478.field_2._M_allocated_capacity = 0;
                  bStack_478.field_2._8_8_ = 0;
                  aaStack_320[0]._M_local_buf[8] = (char)uStack_450;
                  nonstd::optional_lite::detail::
                  storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                  ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                                    *)&local_488);
                }
                oVar11 = local_358[0];
                if (local_358[0] == (ostringstream)0x1) {
                  nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>>
                  ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>>
                               *)local_1a0.data._0_8_,
                              (Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                               *)local_350);
                }
                else {
                  local_500._0_4_ = 8;
                  pPVar25 = (Property *)0x55;
                  ::std::__cxx11::string::_M_replace
                            ((ulong)&local_4f8,0,(char *)local_4f0._M_allocated_capacity,0x6021ce);
                }
                if (local_358[0] == (ostringstream)0x1) {
                  nonstd::optional_lite::detail::
                  storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                  ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                                    *)local_350);
                }
                if (oVar11 != (ostringstream)0x0) {
                  AttrMetas::operator=
                            (local_428,
                             (AttrMetas *)
                             ((long)&(pPVar19->_attrib)._metas.comment.contained + 0x20));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_3a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3f0);
                  local_500 = (undefined1  [8])((ulong)local_500 & 0xffffffff00000000);
                }
                bVar29 = true;
                bVar12 = false;
              }
              if (bVar12) {
                if (*(long *)((long)&(pPVar19->_attrib)._metas.comment.contained + 0x10) !=
                    *(long *)((long)&(pPVar19->_attrib)._metas.comment.contained + 8)) {
                  AttrMetas::operator=
                            (local_428,
                             (AttrMetas *)
                             ((long)&(pPVar19->_attrib)._metas.comment.contained + 0x20));
                  __v = (string *)local_1d0;
                  goto LAB_00230b06;
                }
                goto LAB_00230b13;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                operator_delete(local_3d0._M_dataplus._M_p,
                                local_3d0.field_2._M_allocated_capacity + 1);
              }
              if ((bVar29) || (local_4f8 == local_4f0._M_local_buf + 8)) goto LAB_00230b38;
              uVar23 = CONCAT71(local_4f0._9_7_,local_4f0._M_local_buf[8]);
              _Var24._M_p = local_4f8;
            }
            else {
              local_500._0_4_ = 3;
              ::std::__cxx11::stringstream::stringstream((stringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_350 + 8),"Property type mismatch. ",0x18);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_350 + 8),local_3f0._M_dataplus._M_p,
                                   local_3f0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," expects type `",0xf);
              tinyusdz::value::
              TypeTraits<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
              ::type_name_abi_cxx11_();
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,(char *)local_490,(long)local_488._M_p);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,"` but defined as type `",0x17);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,local_3d0._M_dataplus._M_p,local_3d0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"`",1);
              if (local_490 != (undefined1  [8])auStack_480) {
                operator_delete((void *)local_490,(ulong)((long)auStack_480 + 1));
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&local_4f8,(string *)local_490);
              if (local_490 != (undefined1  [8])auStack_480) {
                operator_delete((void *)local_490,(ulong)((long)auStack_480 + 1));
              }
              ::std::__cxx11::stringstream::~stringstream((stringstream *)local_358);
              ::std::ios_base::~ios_base(local_2d8);
LAB_00230b13:
              uVar23 = local_3d0.field_2._M_allocated_capacity;
              _Var24._M_p = local_3d0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_dataplus._M_p == &local_3d0.field_2) goto LAB_00230b38;
            }
            operator_delete(_Var24._M_p,uVar23 + 1);
          }
LAB_00230b38:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
            operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._0_8_ != &local_1c0) {
            operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
          }
          iVar14 = 0;
          if (((ulong)local_500 & 0xfffffffd) == 0) {
            iVar14 = 3;
LAB_00230db8:
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (local_500._0_4_ != 1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_358,0xf58);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4d8 + 0x10);
              local_4d8._0_8_ = pbVar3;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4d8,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[13],std::__cxx11::string>
                        ((string *)local_490,(fmt *)local_4d8,(string *)"orientations",
                         (char (*) [13])&local_4f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar25);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_358,(char *)local_490,(long)local_488._M_p);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              if (local_490 != (undefined1  [8])auStack_480) {
                operator_delete((void *)local_490,(ulong)((long)auStack_480 + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4d8._0_8_ != pbVar3) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar17 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    (local_4d8,(ulong)(err->_M_dataplus)._M_p);
                pcVar2 = (char *)(puVar17 + 2);
                if ((char *)*puVar17 == pcVar2) {
                  auStack_480 = *(undefined1 (*) [8])pcVar2;
                  bStack_478._M_dataplus._M_p = (pointer)puVar17[3];
                  local_490 = (undefined1  [8])auStack_480;
                }
                else {
                  auStack_480 = *(undefined1 (*) [8])pcVar2;
                  local_490 = (undefined1  [8])*puVar17;
                }
                local_488._M_p = (pointer)puVar17[1];
                *puVar17 = pcVar2;
                puVar17[1] = 0;
                *(undefined1 *)(puVar17 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_490);
                if (local_490 != (undefined1  [8])auStack_480) {
                  operator_delete((void *)local_490,(ulong)((long)auStack_480 + 1));
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4d8._0_8_ != pbVar3) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
              ::std::ios_base::~ios_base(local_2e8);
              iVar14 = 1;
              goto LAB_00230db8;
            }
          }
          if (local_4f8 != local_4f0._M_local_buf + 8) {
            operator_delete(local_4f8,CONCAT71(local_4f0._9_7_,local_4f0._M_local_buf[8]) + 1);
          }
          if (!bVar12) goto LAB_00231d54;
          local_d0[0] = local_c0;
          lVar28 = *(long *)&(pPVar19->_attrib)._variability;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,lVar28,
                     (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar28);
          pPVar25 = (Property *)local_358;
          local_358 = (undefined1  [8])(local_350 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar25,"scales","");
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                    ((ParseResult *)local_490,(_anonymous_namespace_ *)&local_3a8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_d0,(string *)local_448,pPVar25,(string *)local_1a0._40_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffafc,uVar13));
          if (local_358 != (undefined1  [8])(local_350 + 8)) {
            operator_delete((void *)local_358,(ulong)(local_348._M_allocated_capacity + 1));
          }
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],(ulong)((long)&(local_c0[0]->value)._M_dataplus._M_p + 1));
          }
          iVar14 = 0;
          if (((ulong)local_490 & 0xfffffffd) == 0) {
            iVar14 = 3;
LAB_00231112:
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (local_490._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_358,0xf59);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_500 = (undefined1  [8])&local_4f0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_500,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[7],std::__cxx11::string>
                        ((string *)local_4d8,(fmt *)local_500,(string *)"scales",
                         (char (*) [7])&local_488,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar25);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_358,(char *)local_4d8._0_8_,
                                   CONCAT62(local_4d8._10_6_,local_4d8._8_2_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4d8 + 0x10);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4d8._0_8_ != pbVar3) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
              }
              if (local_500 != (undefined1  [8])&local_4f0) {
                operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar16 = (long *)::std::__cxx11::string::_M_append
                                            (local_500,(ulong)(err->_M_dataplus)._M_p);
                pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (plVar16 + 2);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16 ==
                    pbVar1) {
                  pcVar4 = (pbVar1->_M_dataplus)._M_p;
                  local_4d8._16_2_ = SUB82(pcVar4,0);
                  local_4d8._18_6_ = (undefined6)((ulong)pcVar4 >> 0x10);
                  local_4d8._24_2_ = (undefined2)plVar16[3];
                  local_4d8._26_6_ = (undefined6)((ulong)plVar16[3] >> 0x10);
                  local_4d8._0_8_ = pbVar3;
                }
                else {
                  pcVar4 = (pbVar1->_M_dataplus)._M_p;
                  local_4d8._16_2_ = SUB82(pcVar4,0);
                  local_4d8._18_6_ = (undefined6)((ulong)pcVar4 >> 0x10);
                  local_4d8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16
                  ;
                }
                local_4d8._8_2_ = (undefined2)plVar16[1];
                local_4d8._10_6_ = (undefined6)((ulong)plVar16[1] >> 0x10);
                *plVar16 = (long)pbVar1;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_4d8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4d8._0_8_ != pbVar3) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
                }
                if (local_500 != (undefined1  [8])&local_4f0) {
                  operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
              ::std::ios_base::~ios_base(local_2e8);
              iVar14 = 1;
              goto LAB_00231112;
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._M_p !=
              &bStack_478) {
            operator_delete(local_488._M_p,(long)bStack_478._M_dataplus._M_p + 1);
          }
          if (!bVar12) goto LAB_00231d54;
          local_f0[0] = local_e0;
          lVar28 = *(long *)&(pPVar19->_attrib)._variability;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f0,lVar28,
                     (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar28);
          pPVar25 = (Property *)local_358;
          local_358 = (undefined1  [8])(local_350 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar25,"velocities","");
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                    ((ParseResult *)local_490,(_anonymous_namespace_ *)&local_3a8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f0,(string *)local_448,pPVar25,(string *)local_1a0._24_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffafc,uVar13));
          if (local_358 != (undefined1  [8])(local_350 + 8)) {
            operator_delete((void *)local_358,(ulong)(local_348._M_allocated_capacity + 1));
          }
          if (local_f0[0] != local_e0) {
            operator_delete(local_f0[0],(ulong)((long)&local_e0[0]->_M_color + 1));
          }
          iVar14 = 0;
          if (((ulong)local_490 & 0xfffffffd) == 0) {
            iVar14 = 3;
LAB_0023142b:
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (local_490._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_358,0xf5a);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_500 = (undefined1  [8])&local_4f0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_500,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[11],std::__cxx11::string>
                        ((string *)local_4d8,(fmt *)local_500,(string *)"velocities",
                         (char (*) [11])&local_488,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar25);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_358,(char *)local_4d8._0_8_,
                                   CONCAT62(local_4d8._10_6_,local_4d8._8_2_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4d8 + 0x10);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4d8._0_8_ != pbVar3) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
              }
              if (local_500 != (undefined1  [8])&local_4f0) {
                operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar16 = (long *)::std::__cxx11::string::_M_append
                                            (local_500,(ulong)(err->_M_dataplus)._M_p);
                pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (plVar16 + 2);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16 ==
                    pbVar1) {
                  pcVar4 = (pbVar1->_M_dataplus)._M_p;
                  local_4d8._16_2_ = SUB82(pcVar4,0);
                  local_4d8._18_6_ = (undefined6)((ulong)pcVar4 >> 0x10);
                  local_4d8._24_2_ = (undefined2)plVar16[3];
                  local_4d8._26_6_ = (undefined6)((ulong)plVar16[3] >> 0x10);
                  local_4d8._0_8_ = pbVar3;
                }
                else {
                  pcVar4 = (pbVar1->_M_dataplus)._M_p;
                  local_4d8._16_2_ = SUB82(pcVar4,0);
                  local_4d8._18_6_ = (undefined6)((ulong)pcVar4 >> 0x10);
                  local_4d8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16
                  ;
                }
                local_4d8._8_2_ = (undefined2)plVar16[1];
                local_4d8._10_6_ = (undefined6)((ulong)plVar16[1] >> 0x10);
                *plVar16 = (long)pbVar1;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_4d8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4d8._0_8_ != pbVar3) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
                }
                if (local_500 != (undefined1  [8])&local_4f0) {
                  operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
              ::std::ios_base::~ios_base(local_2e8);
              iVar14 = 1;
              goto LAB_0023142b;
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._M_p !=
              &bStack_478) {
            operator_delete(local_488._M_p,(long)bStack_478._M_dataplus._M_p + 1);
          }
          if (!bVar12) goto LAB_00231d54;
          local_110._0_8_ = local_100;
          lVar28 = *(long *)&(pPVar19->_attrib)._variability;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_110,lVar28,(pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar28);
          pPVar25 = (Property *)local_358;
          local_358 = (undefined1  [8])(local_350 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar25,"accelerations","");
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                    ((ParseResult *)local_490,(_anonymous_namespace_ *)&local_3a8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_110,(string *)local_448,pPVar25,(string *)local_1a0._16_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffafc,uVar13));
          if (local_358 != (undefined1  [8])(local_350 + 8)) {
            operator_delete((void *)local_358,(ulong)(local_348._M_allocated_capacity + 1));
          }
          if ((undefined8 *)local_110._0_8_ != local_100) {
            operator_delete((void *)local_110._0_8_,local_100[0] + 1);
          }
          iVar14 = 0;
          if (((ulong)local_490 & 0xfffffffd) == 0) {
            iVar14 = 3;
LAB_00231703:
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (local_490._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_358,0xf5b);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_500 = (undefined1  [8])&local_4f0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_500,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[14],std::__cxx11::string>
                        ((string *)local_4d8,(fmt *)local_500,(string *)"accelerations",
                         (char (*) [14])&local_488,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar25);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_358,(char *)local_4d8._0_8_,
                                   CONCAT62(local_4d8._10_6_,local_4d8._8_2_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4d8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_4d8 + 0x10)) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
              }
              if (local_500 != (undefined1  [8])&local_4f0) {
                operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4d8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_500,err);
                ::std::__cxx11::string::operator=((string *)err,(string *)local_4d8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4d8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_4d8 + 0x10)) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
                }
                if (local_500 != (undefined1  [8])&local_4f0) {
                  operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
              ::std::ios_base::~ios_base(local_2e8);
              iVar14 = 1;
              goto LAB_00231703;
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._M_p !=
              &bStack_478) {
            operator_delete(local_488._M_p,(long)bStack_478._M_dataplus._M_p + 1);
          }
          if (!bVar12) goto LAB_00231d54;
          local_140._16_8_ = local_120;
          lVar28 = *(long *)&(pPVar19->_attrib)._variability;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_140 + 0x10),lVar28,
                     (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar28);
          pPVar25 = (Property *)local_358;
          local_358 = (undefined1  [8])(local_350 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)pPVar25,"angularVelocities","");
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                    ((ParseResult *)local_490,(_anonymous_namespace_ *)&local_3a8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_140 + 0x10),(string *)local_448,pPVar25,(string *)local_1a0._8_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffafc,uVar13));
          if (local_358 != (undefined1  [8])(local_350 + 8)) {
            operator_delete((void *)local_358,(ulong)(local_348._M_allocated_capacity + 1));
          }
          if ((long *)local_140._16_8_ != local_120) {
            operator_delete((void *)local_140._16_8_,local_120[0] + 1);
          }
          iVar14 = 0;
          if (((ulong)local_490 & 0xfffffffd) == 0) {
            iVar14 = 3;
LAB_002319db:
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (local_490._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_358,0xf5c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_500 = (undefined1  [8])&local_4f0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_500,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[18],std::__cxx11::string>
                        ((string *)local_4d8,(fmt *)local_500,(string *)"angularVelocities",
                         (char (*) [18])&local_488,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar25);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_358,(char *)local_4d8._0_8_,
                                   CONCAT62(local_4d8._10_6_,local_4d8._8_2_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4d8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_4d8 + 0x10)) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
              }
              if (local_500 != (undefined1  [8])&local_4f0) {
                operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4d8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_500,err);
                ::std::__cxx11::string::operator=((string *)err,(string *)local_4d8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4d8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_4d8 + 0x10)) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
                }
                if (local_500 != (undefined1  [8])&local_4f0) {
                  operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
              ::std::ios_base::~ios_base(local_2e8);
              iVar14 = 1;
              goto LAB_002319db;
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._M_p !=
              &bStack_478) {
            operator_delete(local_488._M_p,(long)bStack_478._M_dataplus._M_p + 1);
          }
          if (!bVar12) goto LAB_00231d54;
          local_168._24_8_ = local_140;
          lVar28 = *(long *)&(pPVar19->_attrib)._variability;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_168 + 0x18),lVar28,
                     (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar28);
          pPVar25 = (Property *)local_358;
          local_358 = (undefined1  [8])(local_350 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar25,"invisibleIds","");
          (anonymous_namespace)::ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                    ((ParseResult *)local_490,(_anonymous_namespace_ *)&local_3a8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_168 + 0x18),(string *)local_448,pPVar25,local_1a8,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffafc,uVar13));
          if (local_358 != (undefined1  [8])(local_350 + 8)) {
            operator_delete((void *)local_358,(ulong)(local_348._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_168._24_8_ != local_140) {
            operator_delete((void *)local_168._24_8_,local_140._0_8_ + 1);
          }
          iVar14 = 0;
          pkVar22 = local_430;
          if (((ulong)local_490 & 0xfffffffd) == 0) {
            iVar14 = 3;
LAB_00231ccb:
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (local_490._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_358,0xf5d);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_500 = (undefined1  [8])&local_4f0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_500,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[13],std::__cxx11::string>
                        ((string *)local_4d8,(fmt *)local_500,(string *)"invisibleIds",
                         (char (*) [13])&local_488,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar25);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_358,(char *)local_4d8._0_8_,
                                   CONCAT62(local_4d8._10_6_,local_4d8._8_2_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4d8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_4d8 + 0x10)) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
              }
              if (local_500 != (undefined1  [8])&local_4f0) {
                operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4d8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_500,err);
                ::std::__cxx11::string::operator=((string *)err,(string *)local_4d8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4d8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_4d8 + 0x10)) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
                }
                if (local_500 != (undefined1  [8])&local_4f0) {
                  operator_delete((void *)local_500,(ulong)(local_4f0._M_allocated_capacity + 1));
                }
              }
              pkVar22 = local_430;
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
              ::std::ios_base::~ios_base(local_2e8);
              iVar14 = 1;
              goto LAB_00231ccb;
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._M_p !=
              &bStack_478) {
            operator_delete(local_488._M_p,(long)bStack_478._M_dataplus._M_p + 1);
          }
          if (bVar12) {
            cVar18 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_3a8,pkVar22);
            p_Var26 = &local_3a8._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)cVar18._M_node == p_Var26) {
              this_00 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                      *)local_1b0,pkVar22);
              Property::operator=(this_00,local_448);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_3a8,pkVar22);
            }
            cVar18 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_3a8,pkVar22);
            iVar14 = 0;
            if ((_Rb_tree_header *)cVar18._M_node == p_Var26) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_358,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_358,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_358,0xf60);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_490,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pkVar22);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_358,(char *)local_490,(long)local_488._M_p);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              if (local_490 != (undefined1  [8])auStack_480) {
                operator_delete((void *)local_490,(ulong)((long)auStack_480 + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_490,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4d8,err);
LAB_0022ffdb:
                ::std::__cxx11::string::operator=((string *)err,(string *)local_490);
                if (local_490 != (undefined1  [8])auStack_480) {
                  operator_delete((void *)local_490,(ulong)((long)auStack_480 + 1));
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4d8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_4d8 + 0x10)) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT62(local_4d8._18_6_,local_4d8._16_2_) + 1);
                }
              }
LAB_00230011:
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
              ::std::ios_base::~ios_base(local_2e8);
              iVar14 = 1;
            }
          }
        }
LAB_00231d54:
        if ((iVar14 != 3) && (iVar14 != 0)) break;
        pPVar19 = (Property *)::std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar19);
        local_418 = CONCAT71((int7)((ulong)pPVar19 >> 8),pPVar19 == pPVar27);
      } while (pPVar19 != pPVar27);
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_3a8,(_Link_type)local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)((byte)local_418 & 1);
}

Assistant:

bool ReconstructPrim<PointInstancer>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    PointInstancer *instancer,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct PointInstancer.");

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, instancer, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TARGET_PATHS_RELATION(table, prop, "prototypes", instancer->prototypes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "protoIndices", PointInstancer, instancer->protoIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ids", PointInstancer, instancer->ids)
    PARSE_TYPED_ATTRIBUTE(table, prop, "positions", PointInstancer, instancer->positions)
    PARSE_TYPED_ATTRIBUTE(table, prop, "orientations", PointInstancer, instancer->orientations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "scales", PointInstancer, instancer->scales)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", PointInstancer, instancer->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", PointInstancer, instancer->accelerations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "angularVelocities", PointInstancer, instancer->angularVelocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "invisibleIds", PointInstancer, instancer->invisibleIds)

    ADD_PROPERTY(table, prop, PointInstancer, instancer->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}